

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

JavascriptString * GetPropertyDisplayNameForError(Var prop,ScriptContext *scriptContext)

{
  bool bVar1;
  PropertyRecord *propertyRecord;
  undefined8 local_38;
  JavascriptSymbol *symbol;
  JavascriptString *str;
  ScriptContext *scriptContext_local;
  Var prop_local;
  
  bVar1 = Js::VarIs<Js::JavascriptSymbol>(prop);
  if (bVar1) {
    local_38 = Js::UnsafeVarTo<Js::JavascriptSymbol>(prop);
  }
  else {
    local_38 = (JavascriptSymbol *)0x0;
  }
  if (local_38 == (JavascriptSymbol *)0x0) {
    symbol = (JavascriptSymbol *)Js::JavascriptConversion::ToString(prop,scriptContext);
  }
  else {
    propertyRecord = Js::JavascriptSymbol::GetValue(local_38);
    symbol = (JavascriptSymbol *)Js::JavascriptSymbol::ToString(propertyRecord,scriptContext);
  }
  return (JavascriptString *)symbol;
}

Assistant:

Js::JavascriptString* GetPropertyDisplayNameForError(Var prop, ScriptContext* scriptContext)
    {
        JavascriptString* str;
        JavascriptSymbol *symbol = JavascriptOperators::TryFromVar<JavascriptSymbol>(prop);
        if (symbol)
        {
            str = JavascriptSymbol::ToString(symbol->GetValue(), scriptContext);
        }
        else
        {
            str = JavascriptConversion::ToString(prop, scriptContext);
        }

        return str;
    }